

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

size_t bssl::ssl_max_handshake_message_len(SSL *ssl)

{
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = SSL_in_init(ssl);
  if (iVar2 == 0) {
    uVar1 = ssl_protocol_version(ssl);
    if (uVar1 < 0x304) {
      return 0;
    }
    if ((ssl->field_0xa4 & 1) != 0) {
      return 1;
    }
  }
  else if (((ssl->field_0xa4 & 1) != 0) &&
          ((((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->verify_mode & 1) == 0))
  {
    return 0x4000;
  }
  sVar3 = 0x4000;
  if (0x4000 < ssl->max_cert_list) {
    sVar3 = (size_t)ssl->max_cert_list;
  }
  return sVar3;
}

Assistant:

size_t ssl_max_handshake_message_len(const SSL *ssl) {
  // kMaxMessageLen is the default maximum message size for handshakes which do
  // not accept peer certificate chains.
  static const size_t kMaxMessageLen = 16384;

  if (SSL_in_init(ssl)) {
    SSL_CONFIG *config = ssl->config.get();  // SSL_in_init() implies not NULL.
    if ((!ssl->server || (config->verify_mode & SSL_VERIFY_PEER)) &&
        kMaxMessageLen < ssl->max_cert_list) {
      return ssl->max_cert_list;
    }
    return kMaxMessageLen;
  }

  if (ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    // In TLS 1.2 and below, the largest acceptable post-handshake message is
    // a HelloRequest.
    return 0;
  }

  if (ssl->server) {
    // The largest acceptable post-handshake message for a server is a
    // KeyUpdate. We will never initiate post-handshake auth.
    return 1;
  }

  // Clients must accept NewSessionTicket, so allow the default size or
  // max_cert_list, whichever is greater.
  return std::max(kMaxMessageLen, size_t{ssl->max_cert_list});
}